

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall Safaia::Log::Log(Log *this)

{
  int iVar1;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  Log *local_10;
  Log *this_local;
  
  local_10 = this;
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  this->is_stdout = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->str_reset,"\x1b[0m",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->str_green,"\x1b[32m",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->str_yellow,"\x1b[33m",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->str_red,"\x1b[1m\x1b[31m",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  this->ansi_color = true;
  this->level = 3;
  return;
}

Assistant:

Log(){
            
        }